

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O2

long gzoffset64(gzFile file)

{
  __off_t _Var1;
  __off_t _Var2;
  
  _Var2 = -1;
  if ((file != (gzFile)0x0) && ((*file == 0x79b1 || (*file == 0x1c4f)))) {
    _Var1 = lseek(*(int *)((long)file + 4),0,1);
    if ((_Var1 != -1) && (_Var2 = _Var1, *file == 0x1c4f)) {
      _Var2 = _Var1 - (ulong)*(uint *)((long)file + 0x80);
    }
  }
  return _Var2;
}

Assistant:

z_off64_t ZEXPORT gzoffset64(gzFile file)
{
    z_off64_t offset;
    gz_statep state;

    /* get internal structure and check integrity */
    if (file == NULL)
        return -1;
    state = (gz_statep)file;
    if (state->mode != GZ_READ && state->mode != GZ_WRITE)
        return -1;

    /* compute and return effective offset in file */
    offset = LSEEK(state->fd, 0, SEEK_CUR);
    if (offset == -1)
        return -1;
    if (state->mode == GZ_READ)             /* reading */
        offset -= state->strm.avail_in;     /* don't count buffered input */
    return offset;
}